

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpdatableModelValidatorTests.cpp
# Opt level: O3

int testMissingBeta1Parameter(void)

{
  bool bVar1;
  ostream *poVar2;
  TypeUnion TVar3;
  int iVar4;
  Model m;
  Result res;
  Model MStack_f8;
  undefined1 local_c8 [8];
  _Alloc_hider local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  undefined1 local_a0 [8];
  _Alloc_hider local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> local_78;
  _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> local_48;
  
  CoreML::Specification::Model::Model(&MStack_f8);
  buildBasicUpdatableModelWithCategoricalCrossEntropyAndSoftmax(&MStack_f8);
  CoreML::Model::validate((Result *)local_c8,&MStack_f8);
  bVar1 = CoreML::Result::good((Result *)local_c8);
  if (bVar1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
               ,0x7c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x3a5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"!((res).good())",0xf);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  }
  else {
    if (MStack_f8._oneof_case_[0] != 500) {
      CoreML::Specification::Model::clear_Type(&MStack_f8);
      MStack_f8._oneof_case_[0] = 500;
      TVar3.pipelineclassifier_ = (PipelineClassifier *)operator_new(0x58);
      CoreML::Specification::NeuralNetwork::NeuralNetwork(TVar3.neuralnetwork_);
      MStack_f8.Type_.pipelineclassifier_ = TVar3.pipelineclassifier_;
    }
    addLearningRate<CoreML::Specification::NeuralNetwork>
              (MStack_f8.Type_.neuralnetwork_,kAdamOptimizer,0.699999988079071,0.0,1.0);
    if (MStack_f8._oneof_case_[0] != 500) {
      CoreML::Specification::Model::clear_Type(&MStack_f8);
      MStack_f8._oneof_case_[0] = 500;
      TVar3.pipelineclassifier_ = (PipelineClassifier *)operator_new(0x58);
      CoreML::Specification::NeuralNetwork::NeuralNetwork(TVar3.neuralnetwork_);
      MStack_f8.Type_.pipelineclassifier_ = TVar3.pipelineclassifier_;
    }
    local_48._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_48._M_impl.super__Rb_tree_header._M_header;
    local_48._M_impl._0_8_ = 0;
    local_48._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_48._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    local_48._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_48._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_48._M_impl.super__Rb_tree_header._M_header._M_right =
         local_48._M_impl.super__Rb_tree_header._M_header._M_left;
    addMiniBatchSize<CoreML::Specification::NeuralNetwork>
              (MStack_f8.Type_.neuralnetwork_,kAdamOptimizer,10,5,100,
               (set<long,_std::less<long>,_std::allocator<long>_> *)&local_48);
    std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::
    ~_Rb_tree(&local_48);
    if (MStack_f8._oneof_case_[0] != 500) {
      CoreML::Specification::Model::clear_Type(&MStack_f8);
      MStack_f8._oneof_case_[0] = 500;
      TVar3.pipelineclassifier_ = (PipelineClassifier *)operator_new(0x58);
      CoreML::Specification::NeuralNetwork::NeuralNetwork(TVar3.neuralnetwork_);
      MStack_f8.Type_.pipelineclassifier_ = TVar3.pipelineclassifier_;
    }
    local_78._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_78._M_impl.super__Rb_tree_header._M_header;
    local_78._M_impl._0_8_ = 0;
    local_78._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_78._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    local_78._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_78._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_78._M_impl.super__Rb_tree_header._M_header._M_right =
         local_78._M_impl.super__Rb_tree_header._M_header._M_left;
    addEpochs<CoreML::Specification::NeuralNetwork>
              (MStack_f8.Type_.neuralnetwork_,100,1,100,
               (set<long,_std::less<long>,_std::allocator<long>_> *)&local_78);
    std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::
    ~_Rb_tree(&local_78);
    if (MStack_f8._oneof_case_[0] != 500) {
      CoreML::Specification::Model::clear_Type(&MStack_f8);
      MStack_f8._oneof_case_[0] = 500;
      TVar3.pipelineclassifier_ = (PipelineClassifier *)operator_new(0x58);
      CoreML::Specification::NeuralNetwork::NeuralNetwork(TVar3.neuralnetwork_);
      MStack_f8.Type_.pipelineclassifier_ = TVar3.pipelineclassifier_;
    }
    addBeta2(MStack_f8.Type_.neuralnetwork_,kAdamOptimizer,0.699999988079071,0.0,1.0);
    if (MStack_f8._oneof_case_[0] != 500) {
      CoreML::Specification::Model::clear_Type(&MStack_f8);
      MStack_f8._oneof_case_[0] = 500;
      TVar3.pipelineclassifier_ = (PipelineClassifier *)operator_new(0x58);
      CoreML::Specification::NeuralNetwork::NeuralNetwork(TVar3.neuralnetwork_);
      MStack_f8.Type_.pipelineclassifier_ = TVar3.pipelineclassifier_;
    }
    addEps(MStack_f8.Type_.neuralnetwork_,kAdamOptimizer,0.699999988079071,0.0,1.0);
    CoreML::Model::validate((Result *)local_a0,&MStack_f8);
    local_c8 = local_a0;
    std::__cxx11::string::operator=((string *)&local_c0,(string *)&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_p != &local_88) {
      operator_delete(local_98._M_p,local_88._M_allocated_capacity + 1);
    }
    bVar1 = CoreML::Result::good((Result *)local_c8);
    if (bVar1) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
                 ,0x7c);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x3af);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,": error: ",9);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"!((res).good())",0xf);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," was false, expected true.",0x1a);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    }
    else {
      if (MStack_f8._oneof_case_[0] != 500) {
        CoreML::Specification::Model::clear_Type(&MStack_f8);
        MStack_f8._oneof_case_[0] = 500;
        TVar3.pipelineclassifier_ = (PipelineClassifier *)operator_new(0x58);
        CoreML::Specification::NeuralNetwork::NeuralNetwork(TVar3.neuralnetwork_);
        MStack_f8.Type_.pipelineclassifier_ = TVar3.pipelineclassifier_;
      }
      addBeta1(MStack_f8.Type_.neuralnetwork_,kAdamOptimizer,0.699999988079071,0.0,1.0);
      CoreML::Model::validate((Result *)local_a0,&MStack_f8);
      local_c8 = local_a0;
      std::__cxx11::string::operator=((string *)&local_c0,(string *)&local_98);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_p != &local_88) {
        operator_delete(local_98._M_p,local_88._M_allocated_capacity + 1);
      }
      bVar1 = CoreML::Result::good((Result *)local_c8);
      iVar4 = 0;
      if (bVar1) goto LAB_001a61f9;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
                 ,0x7c);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x3b5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,": error: ",9);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"(res).good()",0xc);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," was false, expected true.",0x1a);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    }
  }
  std::ostream::put((char)poVar2);
  iVar4 = 1;
  std::ostream::flush();
LAB_001a61f9:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_p != &local_b0) {
    operator_delete(local_c0._M_p,local_b0._M_allocated_capacity + 1);
  }
  CoreML::Specification::Model::~Model(&MStack_f8);
  return iVar4;
}

Assistant:

int testMissingBeta1Parameter() {

    Specification::Model m;

    // basic neural network model without any updatable model parameters.
    buildBasicUpdatableModelWithCategoricalCrossEntropyAndSoftmax(m);

    // expect validation to fail due to missing updatable model parameters.
    Result res = Model::validate(m);
    ML_ASSERT_BAD(res);

    // now add an updatable model parameter.
    addLearningRate(m.mutable_neuralnetwork(), Specification::Optimizer::kAdamOptimizer, 0.7f, 0.0f, 1.0f);
    addMiniBatchSize(m.mutable_neuralnetwork(), Specification::Optimizer::kAdamOptimizer, 10, 5, 100, std::set<int64_t>());
    addEpochs(m.mutable_neuralnetwork(), 100, 1, 100, std::set<int64_t>());
    addBeta2(m.mutable_neuralnetwork(), Specification::Optimizer::kAdamOptimizer, 0.7f, 0.0f, 1.0f);
    addEps(m.mutable_neuralnetwork(), Specification::Optimizer::kAdamOptimizer, 0.7f, 0.0f, 1.0f);

    res = Model::validate(m);
    ML_ASSERT_BAD(res);

    addBeta1(m.mutable_neuralnetwork(), Specification::Optimizer::kAdamOptimizer, 0.7f, 0.0f, 1.0f);

    // expect validation to pass.
    res = Model::validate(m);
    ML_ASSERT_GOOD(res);
    return 0;
}